

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_lt_mpi_ct(mbedtls_mpi *X,mbedtls_mpi *Y,uint *ret)

{
  void *x;
  uint uVar1;
  mbedtls_ct_condition_t mVar2;
  mbedtls_ct_condition_t mVar3;
  size_t sVar4;
  mbedtls_ct_condition_t lt;
  size_t i;
  void *p [2];
  mbedtls_ct_condition_t result;
  mbedtls_ct_condition_t Y_is_negative;
  mbedtls_ct_condition_t X_is_negative;
  mbedtls_ct_condition_t different_sign;
  uint *ret_local;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  if (X->n == Y->n) {
    mVar2 = mbedtls_ct_bool((long)((int)((int)X->s & 2U) >> 1));
    mVar3 = mbedtls_ct_bool((long)((int)((int)Y->s & 2U) >> 1));
    mVar3 = mbedtls_ct_bool_ne(mVar2,mVar3);
    p[1] = (void *)mbedtls_ct_bool_and(mVar3,mVar2);
    p[0] = Y->p;
    sVar4 = mbedtls_ct_size_if_else_0(mVar2,1);
    mVar2 = mbedtls_mpi_core_lt_ct
                      ((mbedtls_mpi_uint *)p[sVar4 - 1],(mbedtls_mpi_uint *)p[(sVar4 ^ 1) - 1],
                       (ulong)X->n);
    x = p[1];
    mVar3 = mbedtls_ct_bool_not(mVar3);
    mVar2 = mbedtls_ct_bool_and(mVar3,mVar2);
    p[1] = (void *)mbedtls_ct_bool_or((mbedtls_ct_condition_t)x,mVar2);
    uVar1 = mbedtls_ct_uint_if_else_0((mbedtls_ct_condition_t)p[1],1);
    *ret = uVar1;
    X_local._4_4_ = 0;
  }
  else {
    X_local._4_4_ = -4;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_lt_mpi_ct(const mbedtls_mpi *X,
                          const mbedtls_mpi *Y,
                          unsigned *ret)
{
    mbedtls_ct_condition_t different_sign, X_is_negative, Y_is_negative, result;

    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);
    MPI_VALIDATE_RET(ret != NULL);

    if (X->n != Y->n) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /*
     * Set N_is_negative to MBEDTLS_CT_FALSE if N >= 0, MBEDTLS_CT_TRUE if N < 0.
     * We know that N->s == 1 if N >= 0 and N->s == -1 if N < 0.
     */
    X_is_negative = mbedtls_ct_bool((X->s & 2) >> 1);
    Y_is_negative = mbedtls_ct_bool((Y->s & 2) >> 1);

    /*
     * If the signs are different, then the positive operand is the bigger.
     * That is if X is negative (X_is_negative == 1), then X < Y is true and it
     * is false if X is positive (X_is_negative == 0).
     */
    different_sign = mbedtls_ct_bool_ne(X_is_negative, Y_is_negative); // true if different sign
    result = mbedtls_ct_bool_and(different_sign, X_is_negative);

    /*
     * Assuming signs are the same, compare X and Y. We switch the comparison
     * order if they are negative so that we get the right result, regardles of
     * sign.
     */

    /* This array is used to conditionally swap the pointers in const time */
    void * const p[2] = { X->p, Y->p };
    size_t i = mbedtls_ct_size_if_else_0(X_is_negative, 1);
    mbedtls_ct_condition_t lt = mbedtls_mpi_core_lt_ct(p[i], p[i ^ 1], X->n);

    /*
     * Store in result iff the signs are the same (i.e., iff different_sign == false). If
     * the signs differ, result has already been set, so we don't change it.
     */
    result = mbedtls_ct_bool_or(result,
                                mbedtls_ct_bool_and(mbedtls_ct_bool_not(different_sign), lt));

    *ret = mbedtls_ct_uint_if_else_0(result, 1);

    return 0;
}